

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O2

int jpc_unk_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  jpc_msparms_t *pjVar1;
  int iVar2;
  uchar *buf;
  
  (ms->parms).sot.tileno = 0;
  pjVar1 = &ms->parms;
  if (ms->len == 0) {
    (pjVar1->sot).tileno = 0;
    (ms->parms).sot.len = 0;
  }
  else {
    buf = (uchar *)jas_alloc2(ms->len,1);
    (pjVar1->unk).data = buf;
    if (buf == (uchar *)0x0) {
      return -1;
    }
    iVar2 = jas_stream_read(in,buf,(uint)ms->len);
    if (iVar2 != (int)ms->len) {
      jas_free((pjVar1->unk).data);
      return -1;
    }
    (ms->parms).sot.len = ms->len;
  }
  return 0;
}

Assistant:

static int jpc_unk_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_unk_t *unk = &ms->parms.unk;

	unk->data = 0;

	/* Eliminate compiler warning about unused variables. */
	(void)cstate;

	if (ms->len > 0) {
		if (!(unk->data = jas_alloc2(ms->len, sizeof(unsigned char)))) {
			return -1;
		}
		if (jas_stream_read(in, (char *) unk->data, ms->len) !=
		  JAS_CAST(int, ms->len)) {
			jas_free(unk->data);
			return -1;
		}
		unk->len = ms->len;
	} else {
		unk->data = 0;
		unk->len = 0;
	}
	return 0;
}